

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
::_container_insert<std::initializer_list<std::pair<unsigned_int,unsigned_int>>>
          (Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>
           *this,initializer_list<std::pair<unsigned_int,_unsigned_int>_> *column,Index pos,
          Dimension dim)

{
  Column_support *pCVar1;
  size_type sVar2;
  iterator ppVar3;
  node_ptr plVar4;
  type *ptVar5;
  Matrix_all_dimension_holder<int> *this_00;
  node_ptr to_erase;
  pointer pEVar6;
  uint uVar7;
  node_ptr plVar8;
  long lVar9;
  Index local_68;
  uint local_64;
  Matrix_all_dimension_holder<int> *local_60;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>
  local_58;
  
  local_58.operators_ = *(Field_operators **)(this + 0x128);
  pCVar1 = &local_58.column_;
  sVar2 = column->_M_len;
  local_58.entryPool_ = (Entry_constructor *)(local_58.operators_ + 1);
  local_68 = pos;
  local_60 = (Matrix_all_dimension_holder<int> *)this;
  local_58.super_Column_dimension_option.dim_ = dim;
  local_58.column_.super_type.data_.root_plus_size_.m_header.super_node.next_ = (node_ptr)pCVar1;
  local_58.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ = (node_ptr)pCVar1;
  if (sVar2 != 0) {
    ppVar3 = column->_M_array;
    lVar9 = 0;
    do {
      uVar7 = *(uint *)((long)&ppVar3->second + lVar9);
      if ((local_58.operators_)->characteristic_ <= uVar7) {
        uVar7 = uVar7 % (local_58.operators_)->characteristic_;
      }
      local_64 = *(uint *)((long)&ppVar3->first + lVar9);
      pEVar6 = Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
               ::construct<unsigned_int&>
                         ((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
                           *)local_58.entryPool_,&local_64);
      (pEVar6->super_Entry_field_element_option).element_ = uVar7;
      if ((pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ !=
          (node_ptr)0x0) {
        __assert_fail("!safemode_or_autounlink || node_algorithms::inited(to_insert)",
                      "/usr/include/boost/intrusive/list.hpp",0x33c,
                      "iterator boost::intrusive::list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Boundary_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>::Matrix_column_tag, 1>, unsigned long, false, void>::insert(const_iterator, reference) [ValueTraits = boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>>, boost::intrusive::list_node_traits<void *>, boost::intrusive::safe_link, Gudhi::persistence_matrix::Matrix<Boundary_options<false, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false, true>>::Matrix_column_tag, 1>, SizeType = unsigned long, ConstantTimeSize = false, HeaderHolder = void]"
                     );
      }
      (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ =
           local_58.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_;
      (pEVar6->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ =
           (node_ptr)pCVar1;
      ptVar5 = (type *)&(local_58.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_
                        )->next_;
      local_58.column_.super_type.data_.root_plus_size_.m_header.super_node.prev_ =
           (node_ptr)&pEVar6->super_Column_hook;
      (ptVar5->super_type).super_list_node<void_*>.next_ = (node_ptr)&pEVar6->super_Column_hook;
      lVar9 = lVar9 + 8;
    } while (sVar2 << 3 != lVar9);
  }
  this_00 = local_60;
  std::__detail::
  _Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  try_emplace<unsigned_int_const&,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>
            ((_Insert_base<unsigned_int,std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>,std::allocator<std::pair<unsigned_int_const,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options<false,(Gudhi::persistence_matrix::Column_types)7,true,false,true>>>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_60[7].dimensions_.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(const_iterator)0x0,&local_68,&local_58);
  plVar8 = local_58.column_.super_type.data_.root_plus_size_.m_header.super_node.next_;
  while (plVar8 != (node_ptr)pCVar1) {
    plVar4 = (((type *)&plVar8->next_)->data_).root_plus_size_.m_header.super_node.next_;
    plVar8->next_ = (node_ptr)0x0;
    plVar8->prev_ = (node_ptr)0x0;
    Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Boundary_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true>_>_>_>
    ::destroy(&(local_58.entryPool_)->entryPool_,(pointer)&plVar8[-1].prev_);
    plVar8 = plVar4;
  }
  Matrix_all_dimension_holder<int>::update_up(this_00,dim);
  return;
}

Assistant:

inline void Boundary_matrix<Master_matrix>::_container_insert(const Container& column,
                                                              Index pos,
                                                              Dimension dim)
{
  if constexpr (Master_matrix::Option_list::has_map_column_container) {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.try_emplace(pos, Column(pos, column, dim, RA_opt::rows_, colSettings_));
    } else {
      matrix_.try_emplace(pos, Column(column, dim, colSettings_));
    }
  } else {
    if constexpr (Master_matrix::Option_list::has_row_access) {
      matrix_.emplace_back(pos, column, dim, RA_opt::rows_, colSettings_);
    } else {
      if (matrix_.size() <= pos) {
        matrix_.emplace_back(column, dim, colSettings_);
      } else {
        matrix_[pos] = Column(column, dim, colSettings_);
      }
    }
  }
  if constexpr (activeDimOption) {
    Dim_opt::update_up(dim);
  }
}